

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_StoCreateGateMaches
               (Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,int **pComp,int **pPerm,
               int *pnPerms,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,int fPinPerm,
               int fPinQuick)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  word wVar5;
  byte bVar6;
  ulong uVar7;
  word wVar8;
  word uTruth;
  long lVar9;
  int Perm [6];
  
  uVar1 = *(uint *)&pCell->field_0x10;
  if (0x6fffffff < uVar1) {
    __assert_fail("pCell->nFanins <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0xff,
                  "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  uVar2 = pnPerms[uVar1 >> 0x1c];
  if (0xfffffff < uVar1) {
    uVar7 = 0;
    do {
      *(int *)((long)Perm + uVar7 * 2) = (int)uVar7;
      uVar7 = uVar7 + 2;
    } while ((uVar1 >> 0x1c) * 2 != uVar7);
  }
  wVar5 = pCell->uTruth;
  uTruth = wVar5;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    wVar8 = wVar5;
    do {
      lVar9 = 0;
      uTruth = wVar8;
      do {
        Nf_StoCreateGateAdd(vTtMem,vTt2Match,pCell,uTruth,Perm,*(uint *)&pCell->field_0x10 >> 0x1c,
                            vProfs,vStore,fPinFilter,fPinPerm,fPinQuick);
        iVar3 = pComp[*(uint *)&pCell->field_0x10 >> 0x1c][lVar9];
        if (Perm[iVar3] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        bVar6 = (byte)(1 << ((byte)iVar3 & 0x1f));
        uTruth = uTruth << (bVar6 & 0x3f) & s_Truths6[iVar3] |
                 (s_Truths6[iVar3] & uTruth) >> (bVar6 & 0x3f);
        Perm[iVar3] = Perm[iVar3] ^ 1;
        lVar9 = lVar9 + 1;
      } while ((uint)lVar9 >> (byte)(uVar1 >> 0x1c) == 0);
      if (wVar8 != uTruth) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x10e,
                      "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      if (uVar2 != 1) {
        iVar3 = pPerm[*(uint *)&pCell->field_0x10 >> 0x1c][uVar7];
        bVar6 = (byte)(1L << ((byte)iVar3 & 0x3f));
        uTruth = (uTruth & s_PMasks[iVar3][2]) >> (bVar6 & 0x3f) |
                 (s_PMasks[iVar3][1] & uTruth) << (bVar6 & 0x3f) | s_PMasks[iVar3][0] & uTruth;
        iVar4 = Perm[iVar3];
        Perm[iVar3] = Perm[(long)iVar3 + 1];
        Perm[(long)iVar3 + 1] = iVar4;
      }
      uVar7 = uVar7 + 1;
      wVar8 = uTruth;
    } while (uVar7 != uVar2);
  }
  if (wVar5 == uTruth) {
    return;
  }
  __assert_fail("tTemp1 == tCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x117,
                "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
               );
}

Assistant:

void Nf_StoCreateGateMaches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, int ** pComp, int ** pPerm, int * pnPerms, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    int Perm[NF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    assert( pCell->nFanins <= 6 );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Nf_StoCreateGateAdd( vTtMem, vTt2Match, pCell, tCur, Perm, pCell->nFanins, vProfs, vStore, fPinFilter, fPinPerm, fPinQuick );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        if ( nPerms == 1 )
            continue;
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}